

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::ImageDescriptorCase::genFetchCoordStr_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int fetchPosNdx)

{
  int iVar1;
  ostream *poVar2;
  ostringstream local_330 [8];
  ostringstream buf_1;
  ostringstream local_1a8 [8];
  ostringstream buf;
  int local_2c;
  undefined1 local_28 [8];
  IVec3 fetchPos;
  int fetchPosNdx_local;
  ImageDescriptorCase *this_local;
  
  fetchPos.m_data[1] = fetchPosNdx;
  unique0x100002ab = this;
  BindingModel::anon_unknown_1::ImageFetchInstanceImages::getFetchPos
            ((ImageFetchInstanceImages *)local_28,*(VkImageViewType *)((long)this + 0x8c),
             *(deUint32 *)((long)this + 0x90),*(deUint32 *)((long)this + 0x94),fetchPosNdx);
  if (*(int *)((long)this + 0x8c) == 0) {
    local_2c = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_28);
    de::toString<int>(__return_storage_ptr__,&local_2c);
  }
  else if ((*(int *)((long)this + 0x8c) == 4) || (*(int *)((long)this + 0x8c) == 1)) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,"ivec2(");
    iVar1 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_28);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,", ");
    iVar1 = tcu::Vector<int,_3>::y((Vector<int,_3> *)local_28);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::operator<<(poVar2,")");
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_330);
    poVar2 = std::operator<<((ostream *)local_330,"ivec3(");
    iVar1 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_28);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,", ");
    iVar1 = tcu::Vector<int,_3>::y((Vector<int,_3> *)local_28);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,", ");
    iVar1 = tcu::Vector<int,_3>::z((Vector<int,_3> *)local_28);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::operator<<(poVar2,")");
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_330);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ImageDescriptorCase::genFetchCoordStr (int fetchPosNdx) const
{
	DE_ASSERT(m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE || m_descriptorType == vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE);
	const tcu::IVec3 fetchPos = ImageFetchInstanceImages::getFetchPos(m_viewType, m_baseMipLevel, m_baseArraySlice, fetchPosNdx);

	if (m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D)
	{
		return de::toString(fetchPos.x());
	}
	else if (m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY || m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D)
	{
		std::ostringstream buf;
		buf << "ivec2(" << fetchPos.x() << ", " << fetchPos.y() << ")";
		return buf.str();
	}
	else
	{
		std::ostringstream buf;
		buf << "ivec3(" << fetchPos.x() << ", " << fetchPos.y() << ", " << fetchPos.z() << ")";
		return buf.str();
	}
}